

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS
ref_mpi_alltoallv(REF_MPI ref_mpi,void *send,REF_INT *send_size,void *recv,REF_INT *recv_size,
                 REF_INT n,REF_TYPE type)

{
  int iVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  
  lVar4 = (long)ref_mpi->n;
  if (lVar4 == 1) {
    iVar1 = *send_size;
    lVar6 = (long)iVar1;
    lVar4 = (long)*recv_size;
    if (iVar1 == *recv_size) {
      if (type == 1) {
        if (0 < iVar1 * n) {
          lVar4 = 0;
          do {
            *(undefined4 *)((long)recv + lVar4 * 4) = *(undefined4 *)((long)send + lVar4 * 4);
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)*send_size * (long)n);
          return 0;
        }
      }
      else if (type == 2) {
        if (0 < iVar1 * n) {
          uVar2 = 0;
          do {
            *(undefined8 *)((long)recv + uVar2 * 8) = *(undefined8 *)((long)send + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while ((uint)(iVar1 * n) != uVar2);
          return 0;
        }
      }
      else {
        if (type != 3) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",
                 0x2ae,"ref_mpi_alltoallv",6,"data type");
          return 6;
        }
        if (0 < iVar1 * n) {
          uVar2 = 0;
          do {
            *(undefined8 *)((long)recv + uVar2 * 8) = *(undefined8 *)((long)send + uVar2 * 8);
            uVar2 = uVar2 + 1;
          } while ((uint)(iVar1 * n) != uVar2);
          return 0;
        }
      }
      return 0;
    }
    pcVar5 = "without mpi, send and recv should match";
    uVar3 = 0x29f;
  }
  else {
    pcVar5 = "expected 1 part without mpi";
    lVar6 = 1;
    uVar3 = 0x29e;
  }
  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar3,
         "ref_mpi_alltoallv",pcVar5,lVar6,lVar4);
  return 1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_alltoallv(REF_MPI ref_mpi, void *send,
                                     REF_INT *send_size, void *recv,
                                     REF_INT *recv_size, REF_INT n,
                                     REF_TYPE type) {
#ifdef HAVE_MPI
  MPI_Datatype datatype;
  REF_INT *send_disp;
  REF_INT *recv_disp;
  REF_INT *send_size_n;
  REF_INT *recv_size_n;
  REF_INT part;

  if (ref_mpi_native_alltoallv(ref_mpi)) {
    RSS(ref_mpi_alltoallv_native(ref_mpi, send, send_size, recv, recv_size, n,
                                 type),
        "ref_mpi_alltoallv_native");
    return REF_SUCCESS;
  }

  ref_type_mpi_type(type, datatype);

  ref_malloc(send_size_n, ref_mpi_n(ref_mpi), REF_INT);
  each_ref_mpi_part(ref_mpi, part) {
    RAS(0 <= send_size[part], "negative send_size");
    RAS(ref_math_int_multipliable(n, send_size[part]),
        "int overflow send_size_n");
    send_size_n[part] = n * send_size[part];
  }

  ref_malloc(recv_size_n, ref_mpi_n(ref_mpi), REF_INT);
  each_ref_mpi_part(ref_mpi, part) {
    RAS(0 <= recv_size[part], "negative recv_size");
    RAS(ref_math_int_multipliable(n, recv_size[part]),
        "int overflow recv_size_n");
    recv_size_n[part] = n * recv_size[part];
  }

  ref_malloc(send_disp, ref_mpi_n(ref_mpi), REF_INT);
  send_disp[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    RAS(ref_math_int_addable(send_disp[part - 1], send_size_n[part - 1]),
        "int overflow send_disp");
    send_disp[part] = send_disp[part - 1] + send_size_n[part - 1];
  }

  ref_malloc(recv_disp, ref_mpi_n(ref_mpi), REF_INT);
  recv_disp[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    RAS(ref_math_int_addable(recv_disp[part - 1], recv_size_n[part - 1]),
        "int overflow recv_disp");
    recv_disp[part] = recv_disp[part - 1] + recv_size_n[part - 1];
  }

  MPI_Alltoallv(send, send_size_n, send_disp, datatype, recv, recv_size_n,
                recv_disp, datatype, ref_mpi_comm(ref_mpi));

  free(recv_disp);
  free(send_disp);
  free(recv_size_n);
  free(send_size_n);

  return REF_SUCCESS;
#else
  REF_INT i;
  REIS(1, ref_mpi_n(ref_mpi), "expected 1 part without mpi");
  REIS(send_size[0], recv_size[0], "without mpi, send and recv should match");
  switch (type) {
    case REF_INT_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_INT *)recv)[i] = ((REF_INT *)send)[i];
      break;
    case REF_LONG_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_LONG *)recv)[i] = ((REF_LONG *)send)[i];
      break;
    case REF_DBL_TYPE:
      for (i = 0; i < send_size[0] * n; i++)
        ((REF_DBL *)recv)[i] = ((REF_DBL *)send)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  return REF_SUCCESS;
#endif
}